

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntTwoCountCommon(Vec_Int_t *vArr1,Vec_Int_t *vArr2)

{
  int local_3c;
  int Counter;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  pBeg2 = vArr1->pArray;
  pEnd1 = vArr2->pArray;
  local_3c = 0;
  while (pBeg2 < vArr1->pArray + vArr1->nSize && pEnd1 < vArr2->pArray + vArr2->nSize) {
    if (*pBeg2 == *pEnd1) {
      pBeg2 = pBeg2 + 1;
      pEnd1 = pEnd1 + 1;
      local_3c = local_3c + 1;
    }
    else if (*pBeg2 < *pEnd1) {
      pBeg2 = pBeg2 + 1;
    }
    else {
      pEnd1 = pEnd1 + 1;
    }
  }
  return local_3c;
}

Assistant:

static inline int Vec_IntTwoCountCommon( Vec_Int_t * vArr1, Vec_Int_t * vArr2 )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int Counter = 0;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            pBeg1++;
        else 
            pBeg2++;
    }
    return Counter;
}